

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::LocalScanner::doWalkFunction(LocalScanner *this,Function *func)

{
  vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_> *this_00;
  pointer pLVar1;
  bool bVar2;
  uint uVar3;
  Index IVar4;
  uintptr_t in_RAX;
  size_t sVar5;
  ulong uVar6;
  Index index;
  ulong uVar7;
  Type local_38;
  
  this_00 = this->localInfo;
  local_38.id = in_RAX;
  sVar5 = Function::getNumLocals(func);
  std::vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>::resize(this_00,sVar5);
  sVar5 = Function::getNumLocals(func);
  if (sVar5 != 0) {
    uVar6 = 0;
    do {
      pLVar1 = (this->localInfo->
               super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>)._M_impl.
               super__Vector_impl_data._M_start;
      index = (Index)uVar6;
      bVar2 = Function::isParam(func,index);
      if (bVar2) {
        local_38 = Function::getLocalType(func,index);
        IVar4 = 0xffffffff;
        if (local_38.id - 2 < 5) {
          uVar3 = wasm::Type::getByteSize(&local_38);
          IVar4 = uVar3 << 3;
        }
        pLVar1[uVar6].maxBits = IVar4;
        pLVar1[uVar6].signExtBits = 0xffffffff;
      }
      else {
        pLVar1[uVar6].maxBits = 0;
        pLVar1[uVar6].signExtBits = 0;
      }
      uVar6 = (ulong)(index + 1);
      sVar5 = Function::getNumLocals(func);
    } while (uVar6 < sVar5);
  }
  Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::walk
            ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)this,
             &func->body);
  sVar5 = Function::getNumLocals(func);
  if (sVar5 != 0) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      pLVar1 = (this->localInfo->
               super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pLVar1[uVar6].signExtBits == 0xffffffff) {
        pLVar1[uVar6].signExtBits = 0;
      }
      sVar5 = Function::getNumLocals(func);
      bVar2 = uVar7 < sVar5;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // prepare
    localInfo.resize(func->getNumLocals());
    for (Index i = 0; i < func->getNumLocals(); i++) {
      auto& info = localInfo[i];
      if (func->isParam(i)) {
        info.maxBits = getBitsForType(func->getLocalType(i)); // worst-case
        info.signExtBits = LocalInfo::kUnknown; // we will never know anything
      } else {
        info.maxBits = info.signExtBits = 0; // we are open to learning
      }
    }
    // walk
    PostWalker<LocalScanner>::doWalkFunction(func);
    // finalize
    for (Index i = 0; i < func->getNumLocals(); i++) {
      auto& info = localInfo[i];
      if (info.signExtBits == LocalInfo::kUnknown) {
        info.signExtBits = 0;
      }
    }
  }